

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O1

char * duckdb_shell_sqlite3_vmprintf(char *zFormat,__va_list_tag *ap)

{
  char *pcVar1;
  StrAccum acc;
  char zBase [70];
  StrAccum local_78;
  char local_58 [80];
  
  local_78.zText = local_58;
  local_78.db = (void *)0x0;
  local_78.nAlloc = 0x46;
  local_78.mxAlloc = 1000000000;
  local_78.nChar = 0;
  local_78.accError = '\0';
  local_78.printfFlags = '\0';
  duckdb_shell_sqlite3VXPrintf(&local_78,zFormat,ap);
  pcVar1 = duckdb_shell_sqlite3StrAccumFinish(&local_78);
  return pcVar1;
}

Assistant:

char *sqlite3_vmprintf(const char *zFormat, va_list ap) {
	char *z;
	char zBase[SQLITE_PRINT_BUF_SIZE];
	StrAccum acc;

	sqlite3StrAccumInit(&acc, 0, zBase, sizeof(zBase), SQLITE_MAX_LENGTH);
	sqlite3VXPrintf(&acc, zFormat, ap);
	z = sqlite3StrAccumFinish(&acc);
	return z;
}